

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

base_learner * setup_base(options_i *options,vw *all)

{
  reference pp_Var1;
  options_i *in_RSI;
  undefined8 in_RDI;
  learner<char,_char> *base;
  value_type setup_func;
  vw *all_00;
  base_learner *local_8;
  
  pp_Var1 = std::
            stack<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::deque<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>_>
            ::top((stack<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::deque<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>_>
                   *)0x17673f);
  all_00 = (vw *)*pp_Var1;
  std::
  stack<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::deque<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>_>
  ::pop((stack<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::deque<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>_>
         *)0x176758);
  local_8 = (base_learner *)(*(code *)all_00)(in_RDI,in_RSI);
  if (local_8 == (base_learner *)0x0) {
    local_8 = setup_base(in_RSI,all_00);
  }
  return local_8;
}

Assistant:

LEARNER::base_learner* setup_base(options_i& options, vw& all)
{
  auto setup_func = all.reduction_stack.top();
  all.reduction_stack.pop();
  auto base = setup_func(options, all);

  if (base == nullptr)
    return setup_base(options, all);
  else
    return base;
}